

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fnv.cpp
# Opt level: O0

void __thiscall Fnv_StandardVectors_Test::TestBody(Fnv_StandardVectors_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  char *message;
  unsigned_long *in_RCX;
  span<const_unsigned_char,__1L> buf;
  AssertHelper local_70;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  extent_type<_1L> local_38;
  uint64_t local_30;
  uint64_t hval;
  uint8_t *first;
  test_vector *t;
  Fnv_StandardVectors_Test *pFStack_10;
  int test_num;
  Fnv_StandardVectors_Test *this_local;
  
  t._4_4_ = 1;
  pFStack_10 = this;
  for (first = (uint8_t *)&(anonymous_namespace)::fnv_test_str; *(long *)first != 0;
      first = first + 0x10) {
    hval = *(uint64_t *)first;
    join_0x00000010_0x00000000_ =
         (storage_type<pstore::gsl::details::extent_type<_1L>_>)
         pstore::gsl::make_span<unsigned_char_const>
                   ((uchar *)hval,(uchar *)(hval + *(long *)(first + 8)));
    buf.storage_.data_ = (pointer)0xcbf29ce484222325;
    buf.storage_.super_extent_type<_1L>.size_ = local_38.size_;
    local_30 = pstore::fnv_64a_buf<unsigned_char_const,_1l>
                         ((pstore *)
                          gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,buf,(uint64_t)in_RCX);
    in_RCX = &local_30;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_50,"hval","fnv1a_64_vector[test_num - 1].fnv1a_64",in_RCX,
               (unsigned_long *)
               ((anonymous_namespace)::fnv1a_64_vector + (long)(t._4_4_ + -1) * 0x10 + 8));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
    if (!bVar1) {
      testing::Message::Message(local_68);
      pMVar2 = testing::Message::operator<<(local_68,(char (*) [15])"failed test # ");
      pMVar2 = testing::Message::operator<<(pMVar2,(int *)((long)&t + 4));
      message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
      in_RCX = (unsigned_long *)0x220;
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_fnv.cpp"
                 ,0x220,message);
      testing::internal::AssertHelper::operator=(&local_70,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::Message::~Message(local_68);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    t._4_4_ = t._4_4_ + 1;
  }
  return;
}

Assistant:

TEST (Fnv, StandardVectors) {
    auto test_num = 1; // test vector that failed, starting at 1.
    for (test_vector const * t = fnv_test_str; t->buf != nullptr; ++t, ++test_num) {
        auto const * const first = reinterpret_cast<std::uint8_t const *> (t->buf);
        std::uint64_t const hval = pstore::fnv_64a_buf (
            pstore::gsl::make_span (first, first + t->len));
        EXPECT_EQ (hval, fnv1a_64_vector[test_num - 1].fnv1a_64) << "failed test # " << test_num;
    }
}